

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCountTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::TextureCountTests::init(TextureCountTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 internalFormat;
  Context *context;
  undefined4 magFilter_00;
  char *pcVar1;
  Texture2DRenderCase *this_00;
  char *description_00;
  TextureCountTests *pTVar2;
  Matrix<float,_3,_3> local_120;
  allocator<char> local_f9;
  string local_f8 [8];
  string description;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string name;
  int numTextures;
  deUint32 magFilter;
  deUint32 minFilter;
  deUint32 wrapT;
  deUint32 wrapS;
  deUint32 format;
  int cntNdx;
  int formatNdx;
  TextureCountTests *this_local;
  
  format = 0;
  pTVar2 = this;
  while ((int)format < 7) {
    for (wrapS = 0; (int)wrapS < 4; wrapS = wrapS + 1) {
      internalFormat = init::texFormats[(int)format].internalFormat;
      name.field_2._12_4_ = 0x2600;
      name.field_2._8_4_ = init::texCounts[(int)wrapS];
      pcVar1 = init::texFormats[(int)format].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar1,&local_a1);
      std::operator+(&local_80,&local_a0,"_");
      de::toString<int>((string *)((long)&description.field_2 + 8),
                        (int *)(name.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&description.field_2 + 8));
      std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      pcVar1 = glu::getTextureFormatName(internalFormat);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,pcVar1,&local_f9);
      std::allocator<char>::~allocator(&local_f9);
      this_00 = (Texture2DRenderCase *)operator_new(0x218);
      context = (this->super_TestCaseGroup).m_context;
      pcVar1 = (char *)std::__cxx11::string::c_str();
      description_00 = (char *)std::__cxx11::string::c_str();
      magFilter_00 = name.field_2._12_4_;
      tcu::Matrix<float,_3,_3>::Matrix(&local_120);
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,pcVar1,description_00,internalFormat,0x812f,0x812f,0x2600,
                 magFilter_00,&local_120,name.field_2._8_4_,false);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_120);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string((string *)local_60);
    }
    format = format + 1;
    pTVar2 = (TextureCountTests *)(ulong)format;
  }
  return (int)pTVar2;
}

Assistant:

void TextureCountTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB565	},
		{ "rgb8",		GL_RGB8		},
		{ "rgba8",		GL_RGBA8	},
		{ "rgba8ui",	GL_RGBA8UI	},
		{ "rg16f",		GL_RG16F	},
		{ "rgba16f",	GL_RGBA16F	},
		{ "rgba32f",	GL_RGBA32F	}
	};
	static const int texCounts[] = { 1, 2, 4, 8 };

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		for (int cntNdx = 0; cntNdx < DE_LENGTH_OF_ARRAY(texCounts); cntNdx++)
		{
			deUint32	format			= texFormats[formatNdx].internalFormat;
			deUint32	wrapS			= GL_CLAMP_TO_EDGE;
			deUint32	wrapT			= GL_CLAMP_TO_EDGE;
			deUint32	minFilter		= GL_NEAREST;
			deUint32	magFilter		= GL_NEAREST;
			int			numTextures		= texCounts[cntNdx];
			string		name			= string(texFormats[formatNdx].name) + "_" + de::toString(numTextures);
			string		description		= glu::getTextureFormatName(format);

			addChild(new Texture2DRenderCase(m_context, name.c_str(), description.c_str(), format, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
		}
	}
}